

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneticAlgorithm.hpp
# Opt level: O1

void __thiscall
crsGA::
GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
::reset(GeneticAlgorithm<Gen,_crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>,_crsGA::DefaultSelectionPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>,_crsGA::DefaultCrossoverPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>,_crsGA::DefaultReplacementPolicy<crsGA::Chromosome<Gen,_ComputeFitness>,_crsGA::Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>_>_>
        *this)

{
  Chromosome<Gen,_ComputeFitness> *args_3;
  pointer pCVar1;
  element_type *peVar2;
  pointer pGVar3;
  Logger *this_00;
  Gen *g;
  pointer pGVar4;
  Chromosome<Gen,_ComputeFitness> *c;
  pointer pCVar5;
  vector<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  *__range2;
  float local_34;
  
  pCVar5 = (this->_population)._chromosomes.
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar1 = (this->_population)._chromosomes.
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pCVar5 != pCVar1) {
    peVar2 = (this->_data).super___shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    do {
      pGVar3 = (pCVar5->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pGVar4 = (pCVar5->_genes).super__Vector_base<Gen,_std::allocator<Gen>_>._M_impl.
                    super__Vector_impl_data._M_start; pGVar4 != pGVar3; pGVar4 = pGVar4 + 1) {
        (*(pGVar4->super_IGen)._vptr_IGen[3])(pGVar4,peVar2);
      }
      pCVar5 = pCVar5 + 1;
    } while (pCVar5 != pCVar1);
  }
  Population<crsGA::Chromosome<Gen,_ComputeFitness>,_PopulationInitializationPolicy<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
  ::calculateFitness(&this->_population,
                     (this->_data).super___shared_ptr<crsGA::UserData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  this_00 = getLogger();
  args_3 = (this->_population)._chromosomes.
           super__Vector_base<crsGA::Chromosome<Gen,_ComputeFitness>,_std::allocator<crsGA::Chromosome<Gen,_ComputeFitness>_>_>
           ._M_impl.super__Vector_impl_data._M_start + (this->_population)._fittestChromosomeIndex;
  local_34 = args_3->_fitness;
  Logger::debug<char[9],float,char[15],crsGA::Chromosome<Gen,ComputeFitness>,char[2]>
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/rafagaitan[P]crsga/include/crsGA/GeneticAlgorithm.hpp"
             ,0x88,(char (*) [9])"Fitness=",&local_34,(char (*) [15])" Chromosome: {",args_3,
             (char (*) [2])"}");
  return;
}

Assistant:

void reset()
    {
        _population.initializePopulation(_data.get());
        _population.calculateFitness(_data.get());
        LOG_DEBUG("Fitness=", _population.getFittestChromosome().getFitness(), " Chromosome: {", _population.getFittestChromosome(), "}");
    }